

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_2::ImageViewTest::initPrograms
          (ImageViewTest *this,SourceCollections *sourceCollections)

{
  bool bVar1;
  CompressedTexFormat format_00;
  ostream *poVar2;
  void *this_00;
  ProgramSources *pPVar3;
  VkImageViewType VVar4;
  VkImageViewType type;
  undefined8 uVar5;
  VkComponentMapping componentMapping;
  VkComponentMapping componentMapping_00;
  string local_4a8;
  ShaderSource local_488;
  allocator<char> local_459;
  string local_458;
  string local_438;
  ShaderSource local_418;
  allocator<char> local_3e9;
  string local_3e8;
  string local_3c8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  Vector<float,_4> local_398;
  undefined1 local_388 [8];
  Vec4 swizzledBias;
  Vector<float,_4> local_368;
  undefined1 local_358 [8];
  Vec4 swizzledScale;
  Vec4 lookupBias;
  Vec4 lookupScale;
  TextureFormat format;
  char *texCoordSwizzle;
  ostringstream local_308 [8];
  ostringstream fragmentSrc;
  ostringstream local_190 [8];
  ostringstream vertexSrc;
  SourceCollections *sourceCollections_local;
  ImageViewTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  format.order = R;
  format.type = SNORM_INT8;
  bVar1 = ::vk::isCompressedFormat(this->m_imageFormat);
  if (bVar1) {
    format_00 = ::vk::mapVkCompressedFormat(this->m_imageFormat);
    lookupScale.m_data._8_8_ = tcu::getUncompressedFormat(format_00);
  }
  else {
    lookupScale.m_data._8_8_ = ::vk::mapVkFormat(this->m_imageFormat);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(lookupBias.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(swizzledScale.m_data + 2));
  getLookupScaleBias(this->m_imageFormat,(Vec4 *)(lookupBias.m_data + 2),
                     (Vec4 *)(swizzledScale.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_368,(Vector<float,_4> *)(lookupBias.m_data + 2));
  swizzledBias.m_data[2] = (float)(this->m_componentMapping).r;
  swizzledBias.m_data[3] = (float)(this->m_componentMapping).g;
  componentMapping.b = (VkComponentSwizzle)swizzledBias.m_data[2];
  componentMapping.a = (VkComponentSwizzle)swizzledBias.m_data[3];
  componentMapping._0_8_ = &local_368;
  swizzle((Vec4 *)local_358,componentMapping);
  tcu::Vector<float,_4>::Vector(&local_398,(Vector<float,_4> *)(swizzledScale.m_data + 2));
  local_3a8._0_4_ = (this->m_componentMapping).r;
  local_3a8._4_4_ = (this->m_componentMapping).g;
  uVar5._0_4_ = (this->m_componentMapping).b;
  uVar5._4_4_ = (this->m_componentMapping).a;
  componentMapping_00.b = (undefined4)local_3a8;
  componentMapping_00.a = local_3a8._4_4_;
  componentMapping_00._0_8_ = &local_398;
  uStack_3a0 = uVar5;
  swizzle((Vec4 *)local_388,componentMapping_00);
  type = (VkImageViewType)uVar5;
  VVar4 = 0x1315b50;
  switch(this->m_imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    format = (TextureFormat)((long)"%x" + 1);
    type = VVar4;
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    format = (TextureFormat)((long)".xy" + 1);
    type = VVar4;
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    format = (TextureFormat)((long)".xyz" + 1);
    type = VVar4;
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    format = (TextureFormat)anon_var_dwarf_384190;
    type = VVar4;
  }
  poVar2 = std::operator<<((ostream *)local_190,"#version 440\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 1) in vec4 texCoords;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 vtxTexCoords;\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"\tvec4 gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = position;\n");
  poVar2 = std::operator<<(poVar2,"\tvtxTexCoords = texCoords;\n");
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((ostream *)local_308,"#version 440\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0) uniform highp ");
  pipeline::(anonymous_namespace)::ImageViewTest::getGlslSamplerType_abi_cxx11_
            (&local_3c8,(ImageViewTest *)(lookupScale.m_data + 2),
             (TextureFormat *)(ulong)this->m_imageViewType,type);
  poVar2 = std::operator<<(poVar2,(string *)&local_3c8);
  poVar2 = std::operator<<(poVar2," texSampler;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 vtxTexCoords;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 fragColor;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"\tfragColor = ");
  std::__cxx11::string::~string((string *)&local_3c8);
  if (this->m_samplerLod <= 0.0) {
    poVar2 = std::operator<<((ostream *)local_308,"texture(texSampler, vtxTexCoords.");
    poVar2 = std::operator<<(poVar2,(char *)format);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::fixed);
  }
  else {
    poVar2 = std::operator<<((ostream *)local_308,"textureLod(texSampler, vtxTexCoords.");
    poVar2 = std::operator<<(poVar2,(char *)format);
    poVar2 = std::operator<<(poVar2,", ");
    this_00 = (void *)std::ostream::operator<<(poVar2,std::fixed);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,this->m_samplerLod);
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<((ostream *)local_308," * vec4");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::scientific);
  poVar2 = tcu::operator<<(poVar2,(Vector<float,_4> *)local_358);
  poVar2 = std::operator<<(poVar2," + vec4");
  poVar2 = tcu::operator<<(poVar2,(Vector<float,_4> *)local_388);
  poVar2 = std::operator<<(poVar2,";\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"tex_vert",&local_3e9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_3e8);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_418,&local_438);
  glu::ProgramSources::operator<<(pPVar3,&local_418);
  glu::VertexSource::~VertexSource((VertexSource *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"tex_frag",&local_459);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_458);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_488,&local_4a8);
  glu::ProgramSources::operator<<(pPVar3,&local_488);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void ImageViewTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream				vertexSrc;
	std::ostringstream				fragmentSrc;
	const char*						texCoordSwizzle	= DE_NULL;
	const tcu::TextureFormat		format			= (isCompressedFormat(m_imageFormat)) ? tcu::getUncompressedFormat(mapVkCompressedFormat(m_imageFormat))
																						  : mapVkFormat(m_imageFormat);

	tcu::Vec4						lookupScale;
	tcu::Vec4						lookupBias;

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	tcu::Vec4						swizzledScale	= swizzle(lookupScale, m_componentMapping);
	tcu::Vec4						swizzledBias	= swizzle(lookupBias, m_componentMapping);

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			texCoordSwizzle = "x";
			break;
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D:
			texCoordSwizzle = "xy";
			break;
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_3D:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			texCoordSwizzle = "xyz";
			break;
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			texCoordSwizzle = "xyzw";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	vertexSrc << "#version 440\n"
			  << "layout(location = 0) in vec4 position;\n"
			  << "layout(location = 1) in vec4 texCoords;\n"
			  << "layout(location = 0) out highp vec4 vtxTexCoords;\n"
			  << "out gl_PerVertex {\n"
			  << "	vec4 gl_Position;\n"
			  << "};\n"
			  << "void main (void)\n"
			  << "{\n"
			  << "	gl_Position = position;\n"
			  << "	vtxTexCoords = texCoords;\n"
			  << "}\n";

	fragmentSrc << "#version 440\n"
				<< "layout(set = 0, binding = 0) uniform highp " << getGlslSamplerType(format, m_imageViewType) << " texSampler;\n"
				<< "layout(location = 0) in highp vec4 vtxTexCoords;\n"
				<< "layout(location = 0) out highp vec4 fragColor;\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "	fragColor = ";

	if (m_samplerLod > 0.0f)
		fragmentSrc << "textureLod(texSampler, vtxTexCoords." << texCoordSwizzle << ", " << std::fixed <<  m_samplerLod << ")";
	else
		fragmentSrc << "texture(texSampler, vtxTexCoords." << texCoordSwizzle << ")" << std::fixed;

	fragmentSrc << " * vec4" << std::scientific << swizzledScale << " + vec4" << swizzledBias << ";\n"
				<< "}\n";

	sourceCollections.glslSources.add("tex_vert") << glu::VertexSource(vertexSrc.str());
	sourceCollections.glslSources.add("tex_frag") << glu::FragmentSource(fragmentSrc.str());
}